

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O2

Reals __thiscall
Omega_h::coarsen_qualities_tmpl<3,3>
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Alloc *pAVar1;
  int n;
  Int IVar2;
  LO size_in;
  void *extraout_RDX;
  size_t sVar3;
  Reals RVar4;
  Reals out;
  Write<double> qualities;
  Write<int> local_1c0;
  Write<double> local_1b0;
  Write<double> local_1a0;
  Reals coords;
  Read<signed_char> vc_codes;
  LOs vc2c;
  LOs v2vc;
  LOs cv2v;
  LOs ev2v;
  Write<signed_char> is_bad_w;
  type f;
  Adj v2c;
  MetricElementQualities<3,_3> measure;
  
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 3) {
    MetricElementQualities<3,_3>::MetricElementQualities(&measure,mesh);
    Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
    Mesh::ask_elem_verts((Mesh *)&cv2v);
    Mesh::ask_up(&v2c,mesh,0,3);
    Write<int>::Write(&v2vc.write_,(Write<int> *)&v2c);
    Write<int>::Write(&vc2c.write_,&v2c.super_Graph.ab2b.write_);
    Write<signed_char>::Write(&vc_codes.write_,&v2c.codes.write_);
    pAVar1 = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar3 = pAVar1->size;
    }
    else {
      sVar3 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&f,"",(allocator *)&coords);
    n = (int)(sVar3 >> 2);
    Write<double>::Write(&qualities,n * 2,-1.0,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Mesh::coords((Mesh *)&coords);
    size_in = Mesh::nelems(mesh);
    std::__cxx11::string::string((string *)&f,"",(allocator *)&out);
    Write<signed_char>::Write(&is_bad_w,size_in,'\0',(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<int>::Write((Write<int> *)&f,&cands2edges->write_);
    Write<signed_char>::Write(&f.cand_codes.write_,&cand_codes->write_);
    Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
    Write<int>::Write(&f.v2vc.write_,&v2vc.write_);
    Write<int>::Write(&f.vc2c.write_,&vc2c.write_);
    Write<signed_char>::Write(&f.vc_codes.write_,&vc_codes.write_);
    Write<int>::Write(&f.cv2v.write_,&cv2v.write_);
    MetricElementQualities<3,_3>::MetricElementQualities(&f.measure,&measure);
    Write<double>::Write(&f.qualities,&qualities);
    parallel_for<Omega_h::coarsen_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (n,&f,"coarsen_qualities");
    Write<double>::Write(&local_1a0,&qualities);
    Read<double>::Read((Read<signed_char> *)&out,&local_1a0);
    Write<double>::~Write(&local_1a0);
    Write<double>::Write(&local_1b0,&out.write_);
    Write<int>::Write(&local_1c0,&cands2edges->write_);
    Mesh::sync_subset_array<double>
              ((Mesh *)this,(Int)mesh,(Read<double> *)0x1,(LOs *)&local_1b0,-1.0,(Int)&local_1c0);
    Write<int>::~Write(&local_1c0);
    Write<double>::~Write(&local_1b0);
    Write<double>::~Write(&out.write_);
    coarsen_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::
    {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
    Write<signed_char>::~Write(&is_bad_w);
    Write<double>::~Write(&coords.write_);
    Write<double>::~Write(&qualities);
    Write<signed_char>::~Write(&vc_codes.write_);
    Write<int>::~Write(&vc2c.write_);
    Write<int>::~Write(&v2vc.write_);
    Adj::~Adj(&v2c);
    Write<int>::~Write(&cv2v.write_);
    Write<int>::~Write(&ev2v.write_);
    MetricElementQualities<3,_3>::~MetricElementQualities(&measure);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->dim() == mesh_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
       ,0x12);
}

Assistant:

Reals coarsen_qualities_tmpl(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->dim() == mesh_dim);
  MetricElementQualities<mesh_dim, metric_dim> measure(mesh);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_elem_verts();
  auto v2c = mesh->ask_up(VERT, mesh_dim);
  auto v2vc = v2c.a2ab;
  auto vc2c = v2c.ab2b;
  auto vc_codes = v2c.codes;
  auto ncands = cands2edges.size();
  auto qualities = Write<Real>(ncands * 2, -1.0);
  auto coords = mesh->coords();
  auto is_bad_w = Write<Byte>(mesh->nelems(), Byte(0));
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      Real minqual = 1.0;
      for (auto vc = v2vc[v_col]; vc < v2vc[v_col + 1]; ++vc) {
        auto c = vc2c[vc];
        auto vc_code = vc_codes[vc];
        auto ccv_col = code_which_down(vc_code);
        auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
        bool will_die = false;
        for (auto ccv = 0; ccv < (mesh_dim + 1); ++ccv) {
          if ((ccv != ccv_col) && (ccv2v[ccv] == v_onto)) {
            will_die = true;
            break;
          }
        }
        if (will_die) continue;
        OMEGA_H_CHECK(0 <= ccv_col && ccv_col < mesh_dim + 1);
        ccv2v[ccv_col] = v_onto;  // vertices of new cell
        auto qual = measure.measure(ccv2v);
        minqual = min2(minqual, qual);
      }
      qualities[cand * 2 + eev_col] = minqual;
    }
  };
  parallel_for(ncands, f, "coarsen_qualities");
  auto out = Reals(qualities);
  return mesh->sync_subset_array(EDGE, out, cands2edges, -1.0, 2);
}